

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall
JSON::Node::Node(Node *this,string *type,vector<JSON::Node,_std::allocator<JSON::Node>_> *children,
                int start,int end)

{
  std::__cxx11::string::string((string *)this,(string *)type);
  this->start = start;
  this->end = end;
  (this->rawValue)._M_dataplus._M_p = (pointer)&(this->rawValue).field_2;
  (this->rawValue)._M_string_length = 0;
  (this->rawValue).field_2._M_local_buf[0] = '\0';
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&this->children,children);
  return;
}

Assistant:

Node(string type, vector<Node> children, int start, int end)
                : type(type), children(children), start(start), end(end) {
        }